

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::CheckCxxModuleStatus(cmGeneratorTarget *this,string *config)

{
  cmSourceFile *this_00;
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_01;
  bool bVar2;
  int iVar3;
  Cxx20SupportLevel CVar4;
  string *b;
  byte bVar5;
  pointer pBVar6;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string effStandard;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> sources;
  cmStandardLevelResolver standardResolver;
  
  bVar2 = HaveCxx20ModuleSources(this,(string *)0x0);
  if (!bVar2) {
    GetSourceFiles(&sources,this,config);
    bVar5 = 0;
    for (pBVar6 = sources.
                  super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar6 != sources.
                  super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pBVar6 = pBVar6 + 1) {
      this_00 = pBVar6->Value;
      cmSourceFile::GetLanguage_abi_cxx11_(&effStandard,this_00);
      __y._M_str = "CXX";
      __y._M_len = 3;
      __x._M_str = effStandard._M_dataplus._M_p;
      __x._M_len = effStandard._M_string_length;
      bVar2 = std::operator!=(__x,__y);
      if (!bVar2) {
        bVar2 = NeedDyndepForSource(this,&effStandard,config,this_00);
        bVar5 = bVar5 | bVar2;
      }
      std::__cxx11::string::~string((string *)&effStandard);
    }
    std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::~vector(&sources);
    if (bVar5 == 0) {
      return;
    }
  }
  pcVar1 = this->LocalGenerator->GlobalGenerator;
  iVar3 = (*pcVar1->_vptr_cmGlobalGenerator[0xe])(pcVar1,0);
  if ((char)iVar3 == '\0') {
    this_01 = this->Makefile;
    b = GetName_abi_cxx11_(this);
    (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[3])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sources);
    standardResolver.Makefile._0_1_ = 10;
    cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[92],std::__cxx11::string,char,char_const(&)[234]>
              (&effStandard,(char (*) [19])"The target named \"",b,
               (char (*) [92])
               "\" has C++ sources that may use modules, but modules are not supported by this generator:\n  "
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sources,
               (char *)&standardResolver,
               (char (*) [234])
               "Modules are supported only by Ninja, Ninja Multi-Config, and Visual Studio generators for VS 17.4 and newer.  See the cmake-cxxmodules(7) manual for details.  Use the CMAKE_CXX_SCAN_FOR_MODULES variable to enable or disable scanning."
              );
    cmMakefile::IssueMessage(this_01,FATAL_ERROR,&effStandard);
    std::__cxx11::string::~string((string *)&effStandard);
    std::__cxx11::string::~string((string *)&sources);
    return;
  }
  CVar4 = HaveCxxModuleSupport(this,config);
  (*(code *)(&DAT_007dcecc + *(int *)(&DAT_007dcecc + (ulong)CVar4 * 4)))();
  return;
}

Assistant:

void cmGeneratorTarget::CheckCxxModuleStatus(std::string const& config) const
{
  bool haveScannableSources = false;

  // Check for `CXX_MODULE*` file sets and a lack of support.
  if (this->HaveCxx20ModuleSources()) {
    haveScannableSources = true;
  }

  if (!haveScannableSources) {
    // Check to see if there are regular sources that have requested scanning.
    auto sources = this->GetSourceFiles(config);
    for (auto const& source : sources) {
      auto const* sf = source.Value;
      auto const& lang = sf->GetLanguage();
      if (lang != "CXX"_s) {
        continue;
      }
      // Ignore sources which do not need dyndep.
      if (this->NeedDyndepForSource(lang, config, sf)) {
        haveScannableSources = true;
      }
    }
  }

  // If there isn't anything scannable, ignore it.
  if (!haveScannableSources) {
    return;
  }

  // If the generator doesn't support modules at all, error that we have
  // sources that require the support.
  if (!this->GetGlobalGenerator()->CheckCxxModuleSupport(
        cmGlobalGenerator::CxxModuleSupportQuery::Expected)) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("The target named \"", this->GetName(),
               "\" has C++ sources that may use modules, but modules are not "
               "supported by this generator:\n  ",
               this->GetGlobalGenerator()->GetName(), '\n',
               "Modules are supported only by Ninja, Ninja Multi-Config, "
               "and Visual Studio generators for VS 17.4 and newer.  "
               "See the cmake-cxxmodules(7) manual for details.  "
               "Use the CMAKE_CXX_SCAN_FOR_MODULES variable to enable or "
               "disable scanning."));
    return;
  }

  switch (this->HaveCxxModuleSupport(config)) {
    case cmGeneratorTarget::Cxx20SupportLevel::MissingCxx:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The target named \"", this->GetName(),
                 "\" has C++ sources that use modules, but the \"CXX\" "
                 "language has not been enabled."));
      break;
    case cmGeneratorTarget::Cxx20SupportLevel::NoCxx20: {
      cmStandardLevelResolver standardResolver(this->Makefile);
      auto effStandard =
        standardResolver.GetEffectiveStandard(this, "CXX", config);
      if (effStandard.empty()) {
        effStandard = "; no C++ standard found";
      } else {
        effStandard = cmStrCat("; found \"cxx_std_", effStandard, '"');
      }
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "The target named \"", this->GetName(),
          "\" has C++ sources that use modules, but does not include "
          "\"cxx_std_20\" (or newer) among its `target_compile_features`",
          effStandard, '.'));
    } break;
    case cmGeneratorTarget::Cxx20SupportLevel::MissingRule: {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The target named \"", this->GetName(),
                 "\" has C++ sources that may use modules, but the compiler "
                 "does not provide a way to discover the import graph "
                 "dependencies.  See the cmake-cxxmodules(7) manual for "
                 "details.  Use the CMAKE_CXX_SCAN_FOR_MODULES variable to "
                 "enable or disable scanning."));
    } break;
    case cmGeneratorTarget::Cxx20SupportLevel::Supported:
      // All is well.
      break;
  }
}